

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_insertion(cram_container *c,cram_slice *s,cram_record *r,int pos,int len,char *base)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_68;
  double local_60;
  double local_58;
  int local_48;
  int i;
  undefined4 uStack_3c;
  char b;
  cram_feature f;
  char *base_local;
  int len_local;
  int pos_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  
  i = pos + 1;
  f.field_0._8_8_ = base;
  if (len == 1) {
    if (base == (char *)0x0) {
      cVar2 = 'N';
    }
    else {
      cVar2 = *base;
    }
    uStack_3c = 0x69;
    f.field_0.X.pos = (int)cVar2;
    cram_stats_add(c->stats[0x1e],(int)cVar2);
  }
  else {
    uStack_3c = 0x49;
    f.field_0.X.code = (int)s->base_blk->byte;
    f.field_0.X.pos = len;
    if (base == (char *)0x0) {
      for (local_48 = 0; local_48 < len; local_48 = local_48 + 1) {
        while (s->base_blk->alloc <= s->base_blk->byte + 1) {
          if (s->base_blk->alloc == 0) {
            local_60 = 1024.0;
          }
          else {
            sVar1 = s->base_blk->alloc;
            auVar6._8_4_ = (int)(sVar1 >> 0x20);
            auVar6._0_8_ = sVar1;
            auVar6._12_4_ = 0x45300000;
            local_60 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
          }
          s->base_blk->alloc =
               (long)local_60 | (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
          puVar4 = (uchar *)realloc(s->base_blk->data,s->base_blk->alloc);
          s->base_blk->data = puVar4;
        }
        puVar4 = s->base_blk->data;
        sVar1 = s->base_blk->byte;
        s->base_blk->byte = sVar1 + 1;
        puVar4[sVar1] = 'N';
      }
    }
    else {
      while (s->base_blk->alloc <= s->base_blk->byte + (long)len) {
        if (s->base_blk->alloc == 0) {
          local_58 = 1024.0;
        }
        else {
          sVar1 = s->base_blk->alloc;
          auVar5._8_4_ = (int)(sVar1 >> 0x20);
          auVar5._0_8_ = sVar1;
          auVar5._12_4_ = 0x45300000;
          local_58 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
        }
        s->base_blk->alloc =
             (long)local_58 | (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f;
        puVar4 = (uchar *)realloc(s->base_blk->data,s->base_blk->alloc);
        s->base_blk->data = puVar4;
      }
      memcpy(s->base_blk->data + s->base_blk->byte,(void *)f.field_0._8_8_,(long)len);
      s->base_blk->byte = (long)len + s->base_blk->byte;
    }
    while (s->base_blk->alloc <= s->base_blk->byte + 1) {
      if (s->base_blk->alloc == 0) {
        local_68 = 1024.0;
      }
      else {
        sVar1 = s->base_blk->alloc;
        auVar7._8_4_ = (int)(sVar1 >> 0x20);
        auVar7._0_8_ = sVar1;
        auVar7._12_4_ = 0x45300000;
        local_68 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      s->base_blk->alloc =
           (long)local_68 | (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
      puVar4 = (uchar *)realloc(s->base_blk->data,s->base_blk->alloc);
      s->base_blk->data = puVar4;
    }
    puVar4 = s->base_blk->data;
    sVar1 = s->base_blk->byte;
    s->base_blk->byte = sVar1 + 1;
    puVar4[sVar1] = '\0';
  }
  iVar3 = cram_add_feature(c,s,r,(cram_feature *)&i);
  return iVar3;
}

Assistant:

static int cram_add_insertion(cram_container *c, cram_slice *s, cram_record *r,
			      int pos, int len, char *base) {
    cram_feature f;
    f.I.pos = pos+1;
    if (len == 1) {
	char b = base ? *base : 'N';
	f.i.code = 'i';
	f.i.base = b;
	cram_stats_add(c->stats[DS_BA], b);
    } else {
	f.I.code = 'I';
	f.I.len = len;
	f.S.seq_idx = BLOCK_SIZE(s->base_blk);
	if (base) {
	    BLOCK_APPEND(s->base_blk, base, len);
	} else {
	    int i;
	    for (i = 0; i < len; i++)
		BLOCK_APPEND_CHAR(s->base_blk, 'N');
	}
	BLOCK_APPEND_CHAR(s->base_blk, '\0');
    }
    return cram_add_feature(c, s, r, &f);
}